

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcCompare.c
# Opt level: O0

int Mvc_CubeCompareIntOutsideMask(Mvc_Cube_t *pC1,Mvc_Cube_t *pC2,Mvc_Cube_t *pMask)

{
  uint uVar1;
  uint uVar2;
  uint local_34;
  int i;
  uint uBits2;
  uint uBits1;
  Mvc_Cube_t *pMask_local;
  Mvc_Cube_t *pC2_local;
  Mvc_Cube_t *pC1_local;
  
  if ((*(uint *)&pC1->field_0x8 & 0xffffff) == 0) {
    uVar1 = pC1->pData[0] | pMask->pData[0];
    uVar2 = pC2->pData[0] | pMask->pData[0];
    if (uVar1 < uVar2) {
      pC1_local._4_4_ = -1;
    }
    else if (uVar2 < uVar1) {
      pC1_local._4_4_ = 1;
    }
    else {
      pC1_local._4_4_ = 0;
    }
  }
  else if ((*(uint *)&pC1->field_0x8 & 0xffffff) == 1) {
    uVar1 = *(uint *)&pC1->field_0x14 | *(uint *)&pMask->field_0x14;
    uVar2 = *(uint *)&pC2->field_0x14 | *(uint *)&pMask->field_0x14;
    if (uVar1 < uVar2) {
      pC1_local._4_4_ = -1;
    }
    else if (uVar2 < uVar1) {
      pC1_local._4_4_ = 1;
    }
    else {
      uVar1 = pC1->pData[0] | pMask->pData[0];
      uVar2 = pC2->pData[0] | pMask->pData[0];
      if (uVar1 < uVar2) {
        pC1_local._4_4_ = -1;
      }
      else if (uVar2 < uVar1) {
        pC1_local._4_4_ = 1;
      }
      else {
        pC1_local._4_4_ = 0;
      }
    }
  }
  else {
    for (local_34 = *(uint *)&pC1->field_0x8 & 0xffffff; -1 < (int)local_34; local_34 = local_34 - 1
        ) {
      uVar1 = pC1->pData[(int)local_34] | pMask->pData[(int)local_34];
      uVar2 = pC2->pData[(int)local_34] | pMask->pData[(int)local_34];
      if (uVar1 < uVar2) {
        return -1;
      }
      if (uVar2 < uVar1) {
        return 1;
      }
    }
    pC1_local._4_4_ = 0;
  }
  return pC1_local._4_4_;
}

Assistant:

int Mvc_CubeCompareIntOutsideMask( Mvc_Cube_t * pC1, Mvc_Cube_t * pC2, Mvc_Cube_t * pMask )
{
    unsigned uBits1, uBits2;

    // compare the cubes under the mask
    if ( Mvc_Cube1Words(pC1) )
    {
        uBits1 = pC1->pData[0] | pMask->pData[0];
        uBits2 = pC2->pData[0] | pMask->pData[0];
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;
        // cubes are equal
        return 0;
    }
    else if ( Mvc_Cube2Words(pC1) )
    {
        uBits1 = pC1->pData[1] | pMask->pData[1];
        uBits2 = pC2->pData[1] | pMask->pData[1];
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;
        uBits1 = pC1->pData[0] | pMask->pData[0];
        uBits2 = pC2->pData[0] | pMask->pData[0];
        if ( uBits1 < uBits2 )
            return -1;
        if ( uBits1 > uBits2 )
            return 1;
        return 0;
    }
    else                            
    {
        int i = Mvc_CubeReadLast(pC1);
        for(; i >= 0; i--)
        {
            uBits1 = pC1->pData[i] | pMask->pData[i];
            uBits2 = pC2->pData[i] | pMask->pData[i];
            if ( uBits1 < uBits2 )
                return -1;
            if ( uBits1 > uBits2 )
                return 1;
        }
        return 0;
    }
}